

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::string_t,_double> *state,string_t *x,double *y,
               AggregateBinaryInput *binary)

{
  string_t x_data;
  ArgMinMaxState<duckdb::string_t,_double> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  undefined8 *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  double *in_stack_ffffffffffffffd0;
  string_t *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,(idx_t)in_RSI);
    Assign<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               SUB81((ulong)in_RDX >> 0x38,0));
    *in_RDI = 1;
  }
  else {
    x_data.value.pointer.ptr = (char *)in_RCX;
    x_data.value._0_8_ = in_RSI[1];
    Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              ((ArgMinMaxState<duckdb::string_t,_double> *)*in_RSI,x_data,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}